

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightHandle __thiscall
pbrt::LightHandle::Create
          (LightHandle *this,string *name,ParameterDictionary *parameters,Transform *renderFromLight
          ,CameraTransform *cameraTransform,MediumHandle *outsideMedium,FileLoc *loc,Allocator alloc
          )

{
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  PointLight *pPVar5;
  GoniometricLight *pGVar6;
  ProjectionLight *pPVar7;
  DistantLight *pDVar8;
  UniformInfiniteLight *pUVar9;
  RGBColorSpace *pRVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  ImageInfiniteLight *p;
  undefined4 extraout_var_01;
  Transform *loc_00;
  long lVar12;
  uintptr_t iptr;
  DenselySampledSpectrum *pDVar13;
  pointer p_00;
  char *pcVar14;
  CameraTransform *loc_01;
  size_t *psVar15;
  long lVar16;
  ulong uVar17;
  Float FVar18;
  Float FVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [56];
  float fVar23;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Vector3f VVar24;
  Point3f PVar25;
  Float local_38c;
  Allocator alloc_local;
  float local_374;
  RGBColorSpace *colorSpace;
  Float local_358;
  Float local_354;
  Float local_350;
  float local_34c;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> portal;
  string filename;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> L;
  ImageChannelDesc channelDesc;
  Image image;
  SpectrumHandle local_208;
  ColorEncodingHandle local_200;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_1f8;
  SpectrumHandle local_1f0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1e8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1e0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1d8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1d0;
  ImageAndMetadata imageAndMetadata;
  undefined4 extraout_var_00;
  
  alloc_local = alloc;
  (this->
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  ).bits = 0;
  loc_00 = renderFromLight;
  loc_01 = cameraTransform;
  iVar4 = std::__cxx11::string::compare((char *)name);
  if (iVar4 == 0) {
    local_1d0.bits =
         (outsideMedium->
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         ).bits;
    pPVar5 = PointLight::Create(renderFromLight,(MediumHandle *)&local_1d0,parameters,
                                parameters->colorSpace,(FileLoc *)loc_01,alloc_local);
    (this->
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ).bits = (ulong)pPVar5 | 0x1000000000000;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)name);
    if (iVar4 == 0) {
      local_1d8.bits =
           (outsideMedium->
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           ).bits;
      pPVar7 = (ProjectionLight *)
               SpotLight::Create(renderFromLight,(MediumHandle *)&local_1d8,parameters,
                                 parameters->colorSpace,(FileLoc *)loc_01,alloc_local);
      uVar17 = 0x5000000000000;
LAB_003055c2:
      (this->
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      ).bits = uVar17 | (ulong)pPVar7;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)name);
      if (iVar4 == 0) {
        local_1e0.bits =
             (outsideMedium->
             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             ).bits;
        pGVar6 = GoniometricLight::Create
                           (renderFromLight,(MediumHandle *)&local_1e0,parameters,
                            parameters->colorSpace,loc,alloc_local);
        uVar17 = (ulong)pGVar6 | 0x4000000000000;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)name);
        if (iVar4 == 0) {
          local_1e8.bits =
               (outsideMedium->
               super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               ).bits;
          pPVar7 = ProjectionLight::Create
                             (renderFromLight,(MediumHandle *)&local_1e8,parameters,loc,alloc_local)
          ;
          uVar17 = 0x3000000000000;
          goto LAB_003055c2;
        }
        iVar4 = std::__cxx11::string::compare((char *)name);
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare((char *)name);
          if (iVar4 != 0) {
            pcVar14 = "%s: light type unknown.";
            goto LAB_00305b99;
          }
          pRVar10 = parameters->colorSpace;
          pvVar11 = &imageAndMetadata.image.channelNames;
          imageAndMetadata.image._0_8_ = pvVar11;
          std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"L","");
          ParameterDictionary::GetSpectrumArray
                    (&L,parameters,(string *)&imageAndMetadata,Illuminant,alloc_local);
          if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)imageAndMetadata.image._0_8_ != pvVar11) {
            operator_delete((void *)imageAndMetadata.image._0_8_,
                            (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource
                                           )->_vptr_memory_resource + 1));
          }
          imageAndMetadata.image._0_8_ = pvVar11;
          std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"scale","");
          local_38c = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,1.0);
          if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)imageAndMetadata.image._0_8_ != pvVar11) {
            operator_delete((void *)imageAndMetadata.image._0_8_,
                            (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource
                                           )->_vptr_memory_resource + 1));
          }
          imageAndMetadata.image._0_8_ = pvVar11;
          std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"portal","");
          ParameterDictionary::GetPoint3fArray(&portal,parameters,(string *)&imageAndMetadata);
          if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)imageAndMetadata.image._0_8_ != pvVar11) {
            operator_delete((void *)imageAndMetadata.image._0_8_,
                            (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource
                                           )->_vptr_memory_resource + 1));
          }
          image._0_8_ = &image.channelNames;
          std::__cxx11::string::_M_construct<char_const*>((string *)&image,"filename","");
          paVar1 = &channelDesc.offset.field_2;
          channelDesc.offset.alloc.memoryResource = (memory_resource *)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&channelDesc,"");
          ParameterDictionary::GetOneString
                    ((string *)&imageAndMetadata,parameters,(string *)&image,(string *)&channelDesc)
          ;
          ResolveFilename(&filename,(string *)&imageAndMetadata);
          if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)imageAndMetadata.image._0_8_ != pvVar11) {
            operator_delete((void *)imageAndMetadata.image._0_8_,
                            (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource
                                           )->_vptr_memory_resource + 1));
          }
          if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
               *)channelDesc.offset.alloc.memoryResource != paVar1) {
            operator_delete(channelDesc.offset.alloc.memoryResource,
                            channelDesc.offset.field_2._0_8_ + 1);
          }
          if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)image._0_8_ != &image.channelNames) {
            operator_delete((void *)image._0_8_,
                            (ulong)((long)&(image.channelNames.alloc.memoryResource)->
                                           _vptr_memory_resource + 1));
          }
          imageAndMetadata.image._0_8_ = pvVar11;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&imageAndMetadata,"illuminance","");
          FVar18 = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,-1.0);
          if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)imageAndMetadata.image._0_8_ != pvVar11) {
            operator_delete((void *)imageAndMetadata.image._0_8_,
                            (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource
                                           )->_vptr_memory_resource + 1));
          }
          if ((L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
               _M_impl.super__Vector_impl_data._M_start ==
               L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish) && (filename._M_string_length == 0)) {
            pDVar13 = &pRVar10->illuminant;
            local_1f0.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                     )((ulong)pDVar13 | 0x2000000000000);
            FVar19 = SpectrumToPhotometric(&local_1f0);
            uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)FVar18),1);
            bVar3 = (bool)((byte)uVar2 & 1);
            local_38c = (Float)((uint)bVar3 * (int)((FVar18 / 3.1415927) * (local_38c / FVar19)) +
                               (uint)!bVar3 * (int)(local_38c / FVar19));
            imageAndMetadata.image._0_8_ = pDVar13;
            iVar4 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                              (alloc_local.memoryResource,0xd8,8);
            pstd::pmr::polymorphic_allocator<std::byte>::
            construct<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::DenselySampledSpectrum_const*,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                      (&alloc_local,(UniformInfiniteLight *)CONCAT44(extraout_var,iVar4),
                       renderFromLight,(DenselySampledSpectrum **)&imageAndMetadata,&local_38c,
                       &alloc_local);
            (this->
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            ).bits = CONCAT44(extraout_var,iVar4) | 0x7000000000000;
          }
          else if (L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
            local_200.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                     )0;
            Image::Read(&imageAndMetadata,&filename,alloc_local,&local_200);
            colorSpace = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
            image._0_8_ = &image.channelNames;
            std::__cxx11::string::_M_construct<char_const*>((string *)&image,"R","");
            image.channelNames.nAlloc = (size_t)&image.encoding;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&image.channelNames.nAlloc,"G","");
            psVar15 = &image.p8.nStored;
            image.p8.ptr = (uchar *)psVar15;
            std::__cxx11::string::_M_construct<char_const*>((string *)&image.p8.ptr,"B","");
            requestedChannels.n = 3;
            requestedChannels.ptr =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
            Image::GetChannelDesc(&channelDesc,&imageAndMetadata.image,requestedChannels);
            lVar16 = -0x60;
            do {
              if (psVar15 != (size_t *)psVar15[-2]) {
                operator_delete((long *)psVar15[-2],*psVar15 + 1);
              }
              psVar15 = psVar15 + -4;
              lVar16 = lVar16 + 0x20;
            } while (lVar16 != 0);
            if (channelDesc.offset.nStored == 0) {
              ErrorExit<std::__cxx11::string&>
                        (loc,
                         "%s: image provided to \"infinite\" light must have R, G, and B channels.",
                         &filename);
            }
            local_208.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                     )((ulong)&colorSpace->illuminant | 0x2000000000000);
            FVar19 = SpectrumToPhotometric(&local_208);
            local_38c = local_38c / FVar19;
            auVar21 = ZEXT864(0);
            if (0.0 < FVar18) {
              pRVar10 = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
              if (imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y < 1) {
                local_374 = 0.0;
              }
              else {
                local_350 = (pRVar10->XYZFromRGB).m[1][0];
                local_354 = (pRVar10->XYZFromRGB).m[1][1];
                local_358 = (pRVar10->XYZFromRGB).m[1][2];
                lVar16 = 0;
                local_374 = 0.0;
                do {
                  if (0 < imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.x) {
                    fVar23 = (float)imageAndMetadata.image.resolution.
                                    super_Tuple2<pbrt::Point2,_int>.y;
                    uVar17 = 0;
                    do {
                      auVar20._0_4_ =
                           ((float)(int)uVar17 + 0.5) /
                           (float)imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.
                                  x;
                      auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
                      auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)(((float)(int)lVar16 + 0.5) /
                                                                    fVar23)),0x10);
                      VVar24 = EqualAreaSquareToSphere((Point2f)auVar20._0_8_);
                      if (0.0 < VVar24.super_Tuple3<pbrt::Vector3,_float>.z) {
                        local_34c = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
                        Image::GetChannels((ImageChannelValues *)&image,&imageAndMetadata.image,
                                           (Point2i)(lVar16 << 0x20 | uVar17),
                                           (WrapMode2D)0x200000002);
                        pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)image._8_8_;
                        if (image._8_8_ == 0) {
                          pvVar11 = &image.channelNames;
                        }
                        lVar12 = 0;
                        auVar21 = ZEXT464((uint)local_374);
                        do {
                          FVar19 = local_350;
                          if (((int)lVar12 != 0) && (FVar19 = local_354, (int)lVar12 != 1)) {
                            FVar19 = local_358;
                          }
                          auVar20 = vfmadd213ss_fma(ZEXT416((uint)(FVar19 * *(float *)((long)&(
                                                  pvVar11->alloc).memoryResource + lVar12 * 4))),
                                                  ZEXT416((uint)local_34c),auVar21._0_16_);
                          auVar21 = ZEXT1664(auVar20);
                          lVar12 = lVar12 + 1;
                        } while (lVar12 != 3);
                        local_374 = auVar20._0_4_;
                        InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                        ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                        *)&image);
                      }
                      uVar17 = uVar17 + 1;
                    } while ((long)uVar17 <
                             (long)imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>
                                   .x);
                  }
                  lVar16 = lVar16 + 1;
                } while (lVar16 < imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.
                                  y);
              }
              local_38c = (FVar18 / ((6.2831855 /
                                     (float)(imageAndMetadata.image.resolution.
                                             super_Tuple2<pbrt::Point2,_int>.x *
                                            imageAndMetadata.image.resolution.
                                            super_Tuple2<pbrt::Point2,_int>.y)) * local_374)) *
                          local_38c;
              auVar21 = ZEXT464((uint)local_38c);
            }
            Image::SelectChannels(&image,&imageAndMetadata.image,&channelDesc,alloc_local);
            p_00 = portal.
                   super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            if (portal.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                portal.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              iVar4 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                                (alloc_local.memoryResource,0x250,8);
              p = (ImageInfiniteLight *)CONCAT44(extraout_var_01,iVar4);
              pstd::pmr::polymorphic_allocator<std::byte>::
              construct<pbrt::ImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,pstd::pmr::polymorphic_allocator<std::byte>&>
                        (&alloc_local,p,renderFromLight,&image,&colorSpace,&local_38c,&filename,
                         &alloc_local);
              uVar17 = 0x8000000000000;
            }
            else {
              do {
                auVar22 = auVar21._8_56_;
                PVar25 = CameraTransform::RenderFromWorld(cameraTransform,p_00);
                auVar21._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
                auVar21._8_56_ = auVar22;
                uVar2 = vmovlps_avx(auVar21._0_16_);
                (p_00->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar2;
                (p_00->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar2 >> 0x20);
                (p_00->super_Tuple3<pbrt::Point3,_float>).z =
                     PVar25.super_Tuple3<pbrt::Point3,_float>.z;
                p_00 = p_00 + 1;
              } while (p_00 != portal.
                               super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
              iVar4 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                                (alloc_local.memoryResource,0x208,8);
              p = (ImageInfiniteLight *)CONCAT44(extraout_var_00,iVar4);
              pstd::pmr::polymorphic_allocator<std::byte>::
              construct<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                        (&alloc_local,(PortalImageInfiniteLight *)p,renderFromLight,&image,
                         &colorSpace,&local_38c,&filename,&portal,&alloc_local);
              uVar17 = 0x9000000000000;
            }
            (this->
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            ).bits = (ulong)p | uVar17;
            Image::~Image(&image);
            InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                      (&channelDesc.offset);
            ImageAndMetadata::~ImageAndMetadata(&imageAndMetadata);
          }
          else {
            if (filename._M_string_length != 0) {
              pcVar14 = 
              "Can\'t specify both emission \"L\" and \"filename\" with ImageInfiniteLight";
LAB_00305bd2:
              ErrorExit(loc,pcVar14);
            }
            if (portal.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                portal.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              pcVar14 = "Portals are not supported for infinite lights without \"filename\".";
              goto LAB_00305bd2;
            }
            local_1f8.bits =
                 ((L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                 ).bits;
            FVar19 = SpectrumToPhotometric((SpectrumHandle *)&local_1f8);
            uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)FVar18),1);
            bVar3 = (bool)((byte)uVar2 & 1);
            local_38c = (Float)((uint)bVar3 * (int)((FVar18 / 3.1415927) * (local_38c / FVar19)) +
                               (uint)!bVar3 * (int)(local_38c / FVar19));
            pUVar9 = pstd::pmr::polymorphic_allocator<std::byte>::
                     new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                               (&alloc_local,renderFromLight,
                                L.
                                super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                ._M_impl.super__Vector_impl_data._M_start,&local_38c,&alloc_local);
            (this->
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            ).bits = (ulong)pUVar9 | 0x7000000000000;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)filename._M_dataplus._M_p != &filename.field_2) {
            operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
          }
          if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(portal.
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)portal.
                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)portal.
                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(L.
                            super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)L.
                                  super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)L.
                                  super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_00305b6e;
        }
        pDVar8 = DistantLight::Create
                           (renderFromLight,parameters,parameters->colorSpace,(FileLoc *)loc_00,
                            alloc_local);
        uVar17 = (ulong)pDVar8 | 0x2000000000000;
      }
      (this->
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      ).bits = uVar17;
    }
  }
LAB_00305b6e:
  if (((this->
       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
       ).bits & 0xffffffffffff) != 0) {
    ParameterDictionary::ReportUnused(parameters);
    return (LightHandle)
           (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            )this;
  }
  pcVar14 = "%s: unable to create light.";
LAB_00305b99:
  ErrorExit<std::__cxx11::string_const&>(loc,pcVar14,name);
}

Assistant:

LightHandle LightHandle::Create(const std::string &name,
                                const ParameterDictionary &parameters,
                                const Transform &renderFromLight,
                                const CameraTransform &cameraTransform,
                                MediumHandle outsideMedium, const FileLoc *loc,
                                Allocator alloc) {
    LightHandle light = nullptr;
    if (name == "point")
        light = PointLight::Create(renderFromLight, outsideMedium, parameters,
                                   parameters.ColorSpace(), loc, alloc);
    else if (name == "spot")
        light = SpotLight::Create(renderFromLight, outsideMedium, parameters,
                                  parameters.ColorSpace(), loc, alloc);
    else if (name == "goniometric")
        light = GoniometricLight::Create(renderFromLight, outsideMedium, parameters,
                                         parameters.ColorSpace(), loc, alloc);
    else if (name == "projection")
        light = ProjectionLight::Create(renderFromLight, outsideMedium, parameters, loc,
                                        alloc);
    else if (name == "distant")
        light = DistantLight::Create(renderFromLight, parameters, parameters.ColorSpace(),
                                     loc, alloc);
    else if (name == "infinite") {
        const RGBColorSpace *colorSpace = parameters.ColorSpace();
        std::vector<SpectrumHandle> L =
            parameters.GetSpectrumArray("L", SpectrumType::Illuminant, alloc);
        Float scale = parameters.GetOneFloat("scale", 1);
        std::vector<Point3f> portal = parameters.GetPoint3fArray("portal");
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        Float E_v = parameters.GetOneFloat("illuminance", -1);

        if (L.empty() && filename.empty()) {
            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);
            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            // Default: color space's std illuminant
            light = alloc.new_object<UniformInfiniteLight>(
                renderFromLight, &colorSpace->illuminant, scale, alloc);
        } else if (!L.empty()) {
            if (!filename.empty())
                ErrorExit(loc, "Can't specify both emission \"L\" and "
                               "\"filename\" with ImageInfiniteLight");

            if (!portal.empty())
                ErrorExit(loc, "Portals are not supported for infinite lights "
                               "without \"filename\".");

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(L[0]);

            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            light = alloc.new_object<UniformInfiniteLight>(renderFromLight, L[0], scale,
                                                           alloc);
        } else {
            ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc);
            const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();

            ImageChannelDesc channelDesc =
                imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
            if (!channelDesc)
                ErrorExit(loc,
                          "%s: image provided to \"infinite\" light must "
                          "have R, G, and B channels.",
                          filename);

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);

            if (E_v > 0) {
                // Upper hemisphere illuminance calculation for converting map to physical
                // units
                float illuminance = 0;
                const Image &image = imageAndMetadata.image;
                RGB lum = imageAndMetadata.metadata.GetColorSpace()->LuminanceVector();
                for (int y = 0; y < image.Resolution().y; ++y) {
                    float v = (float(y) + 0.5f) / float(image.Resolution().y);
                    for (int x = 0; x < image.Resolution().x; ++x) {
                        Float u = (x + 0.5f) / image.Resolution().x;
                        Vector3f w = EqualAreaSquareToSphere(Point2f(u, v));
                        // We could be more clever and see if we're in the inner rotated
                        // square, but not a big deal...
                        if (w.z <= 0)
                            continue;

                        ImageChannelValues values = image.GetChannels({x, y});
                        for (int c = 0; c < 3; ++c)
                            illuminance += values[c] * lum[c] * CosTheta(w);
                    }
                }
                illuminance *= 2 * Pi / (image.Resolution().x * image.Resolution().y);

                // scaling factor is just the ratio of the target
                // illuminance and the illuminance of the map multiplied by
                // the illuminant spectrum
                Float k_e = illuminance;
                scale *= E_v / k_e;
            }

            Image image = imageAndMetadata.image.SelectChannels(channelDesc, alloc);

            if (!portal.empty()) {
                for (Point3f &p : portal)
                    p = cameraTransform.RenderFromWorld(p);

                light = alloc.new_object<PortalImageInfiniteLight>(
                    renderFromLight, std::move(image), colorSpace, scale, filename,
                    portal, alloc);
            } else
                light = alloc.new_object<ImageInfiniteLight>(renderFromLight,
                                                             std::move(image), colorSpace,
                                                             scale, filename, alloc);
        }
    } else
        ErrorExit(loc, "%s: light type unknown.", name);

    if (!light)
        ErrorExit(loc, "%s: unable to create light.", name);

    parameters.ReportUnused();
    return light;
}